

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O0

void __thiscall DIS::EnvironmentalProcessPdu::EnvironmentalProcessPdu(EnvironmentalProcessPdu *this)

{
  EnvironmentalProcessPdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__EnvironmentalProcessPdu_00271e78;
  EntityID::EntityID(&this->_environementalProcessID);
  EntityType::EntityType(&this->_environmentType);
  this->_modelType = '\0';
  this->_environmentStatus = '\0';
  this->_numberOfEnvironmentRecords = '\0';
  this->_sequenceNumber = 0;
  std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::vector
            (&this->_environmentRecords);
  Pdu::setPduType((Pdu *)this,')');
  return;
}

Assistant:

EnvironmentalProcessPdu::EnvironmentalProcessPdu() : SyntheticEnvironmentFamilyPdu(),
   _environementalProcessID(), 
   _environmentType(), 
   _modelType(0), 
   _environmentStatus(0), 
   _numberOfEnvironmentRecords(0), 
   _sequenceNumber(0)
{
    setPduType( 41 );
}